

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetime.cpp
# Opt level: O2

void setDateTime(QDateTimeData *d,QDate date,QTime time)

{
  QDateTimePrivate *pQVar1;
  uint uVar2;
  QTime QVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  bool bVar7;
  
  QVar3.mds = time.mds;
  if ((uint)time.mds >= 86400000) {
    QVar3.mds = 0;
  }
  bVar7 = 0x16d3e147973 < date.jd + 0xb69eeff91fU;
  lVar4 = date.jd + -0x253d8c;
  if (bVar7) {
    lVar4 = 0;
  }
  uVar5 = 6;
  if (bVar7) {
    uVar5 = (uint)((uint)time.mds < 86400000) << 2;
  }
  uVar2 = QVar3.mds + 0xfad9a400;
  if (QVar3.mds == 0U || lVar4 >= 0) {
    uVar2 = QVar3.mds;
  }
  lVar4 = (ulong)(QVar3.mds != 0U && lVar4 < 0) + lVar4;
  bVar7 = SEXT816(lVar4 * 86400000) == SEXT816(lVar4) * SEXT416(86400000);
  lVar6 = lVar4 * 86400000;
  if (bVar7) {
    lVar6 = lVar4 * 86400000 + (long)(int)uVar2;
  }
  if (!bVar7 || SCARRY8(lVar4 * 86400000,(long)(int)uVar2)) {
    uVar5 = 0;
    lVar6 = 0;
  }
  pQVar1 = d->d;
  if (((ulong)pQVar1 & 1) != 0) {
    if (lVar6 + 0x80000000000000U >> 0x38 == 0) {
      pQVar1 = (QDateTimePrivate *)((ulong)((uint)pQVar1 & 0x31 | uVar5) | lVar6 << 8);
      d->d = pQVar1;
    }
    else {
      QDateTime::Data::detach((Data *)&d->data);
      pQVar1 = d->d;
    }
  }
  if (((ulong)pQVar1 & 1) == 0) {
    QDateTime::Data::detach((Data *)&d->data);
    d->d->m_msecs = lVar6;
    (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
         (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
         super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i & 0xffffff31;
    (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
    super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i =
         (d->d->m_status).super_QFlagsStorageHelper<QDateTimePrivate::StatusFlag,_4>.
         super_QFlagsStorage<QDateTimePrivate::StatusFlag>.i | uVar5;
  }
  return;
}

Assistant:

static void setDateTime(QDateTimeData &d, QDate date, QTime time)
{
    // If the date is valid and the time is not we set time to 00:00:00
    if (!time.isValid() && date.isValid())
        time = QTime::fromMSecsSinceStartOfDay(0);

    QDateTimePrivate::StatusFlags newStatus = { };

    // Set date value and status
    qint64 days = 0;
    if (date.isValid()) {
        days = date.toJulianDay() - JULIAN_DAY_FOR_EPOCH;
        newStatus = QDateTimePrivate::ValidDate;
    }

    // Set time value and status
    int ds = 0;
    if (time.isValid()) {
        ds = time.msecsSinceStartOfDay();
        newStatus |= QDateTimePrivate::ValidTime;
    }
    Q_ASSERT(ds < MSECS_PER_DAY);
    // Only the later parts of the very first day are representable - its start
    // would overflow - so get ds the same side of 0 as days:
    if (days < 0 && ds > 0) {
        days++;
        ds -= MSECS_PER_DAY;
    }

    // Check in representable range:
    qint64 msecs = 0;
    if (daysAndMillisOverflow(days, qint64(ds), &msecs)) {
        newStatus = QDateTimePrivate::StatusFlags{};
        msecs = 0;
    }
    if (d.isShort()) {
        // let's see if we can keep this short
        if (msecsCanBeSmall(msecs)) {
            // yes, we can
            d.data.msecs = qintptr(msecs);
            d.data.status &= ~(QDateTimePrivate::ValidityMask | QDateTimePrivate::DaylightMask).toInt();
            d.data.status |= newStatus.toInt();
        } else {
            // nope...
            d.detach();
        }
    }
    if (!d.isShort()) {
        d.detach();
        d->m_msecs = msecs;
        d->m_status &= ~(QDateTimePrivate::ValidityMask | QDateTimePrivate::DaylightMask);
        d->m_status |= newStatus;
    }
}